

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

void stbtt__dict_get_ints(stbtt__buf *b,int key,int outcount,stbtt_uint32 *out)

{
  uint uVar1;
  stbtt_uint32 sVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uchar *puVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  stbtt__buf operands;
  stbtt__buf local_38;
  
  uVar1 = b->size;
  if ((int)uVar1 < 0) {
    __assert_fail("!(o > b->size || o < 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                  ,0x47d,"void stbtt__buf_seek(stbtt__buf *, int)");
  }
  b->cursor = 0;
  if (uVar1 == 0) {
    return;
  }
  uVar5 = 0;
  do {
    if ((int)uVar5 < (int)uVar1) {
      puVar6 = b->data;
      lVar9 = (long)(int)uVar5;
      uVar10 = (ulong)uVar5;
      bVar4 = puVar6[lVar9];
      while (uVar3 = (uint)uVar10, 0x1b < bVar4) {
        if (bVar4 == 0x1e) {
          stbtt__buf_skip(b,1);
          uVar3 = b->cursor;
          uVar10 = (ulong)uVar3;
          uVar1 = b->size;
          uVar8 = uVar1;
          if ((int)uVar1 < (int)uVar3) {
            uVar8 = uVar3;
          }
          if ((int)uVar3 < (int)uVar1) {
            uVar7 = (long)(int)uVar3;
            do {
              uVar10 = uVar7 + 1;
              b->cursor = (int)uVar7 + 1;
              if (((~b->data[uVar7] & 0xf) == 0) || ((b->data[uVar7] & 0xf0) == 0xf0)) break;
              bVar11 = (long)(int)uVar8 - 1U != uVar7;
              uVar7 = uVar10;
            } while (bVar11);
          }
        }
        else {
          stbtt__cff_int(b);
          uVar10 = (ulong)(uint)b->cursor;
          uVar1 = b->size;
        }
        uVar3 = (uint)uVar10;
        if ((int)uVar1 <= (int)uVar3) {
          uVar10 = uVar10 & 0xffffffff;
          goto LAB_00193c22;
        }
        puVar6 = b->data;
        lVar9 = (long)(int)uVar3;
        bVar4 = puVar6[lVar9];
      }
      uVar10 = (long)(int)uVar3 + 1;
      b->cursor = (int)uVar10;
      uVar8 = (uint)puVar6[lVar9];
      if ((puVar6[lVar9] == 0xc) && (uVar8 = 0x100, (int)uVar10 < (int)uVar1)) {
        b->cursor = uVar3 + 2;
        uVar8 = puVar6[uVar10] | 0x100;
        uVar10 = (ulong)(uVar3 + 2);
      }
    }
    else {
      uVar10 = (ulong)uVar5;
      uVar3 = uVar5;
LAB_00193c22:
      uVar8 = 0;
    }
    if (uVar8 == key) {
      if ((int)(uVar3 - uVar5 | uVar5) < 0) {
        return;
      }
      if ((int)uVar1 < (int)uVar5) {
        return;
      }
      if ((int)uVar1 < (int)uVar3) {
        return;
      }
      local_38.data = b->data + uVar5;
      local_38._8_8_ = (ulong)(uVar3 - uVar5) << 0x20;
      if (outcount < 1) {
        return;
      }
      if (uVar3 == uVar5) {
        return;
      }
      uVar10 = 1;
      do {
        sVar2 = stbtt__cff_int(&local_38);
        out[uVar10 - 1] = sVar2;
        if ((uint)outcount <= uVar10) {
          return;
        }
        uVar10 = uVar10 + 1;
      } while (local_38.cursor < local_38.size);
      return;
    }
    uVar5 = (uint)uVar10;
    if ((int)uVar1 <= (int)uVar5) {
      return;
    }
  } while( true );
}

Assistant:

static void stbtt__dict_get_ints(stbtt__buf *b, int key, int outcount, stbtt_uint32 *out)
{
   int i;
   stbtt__buf operands = stbtt__dict_get(b, key);
   for (i = 0; i < outcount && operands.cursor < operands.size; i++)
      out[i] = stbtt__cff_int(&operands);
}